

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  CppType CVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int64_t iVar9;
  int64_t iVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  LogMessage *pLVar13;
  LogMessage local_90;
  Voidify local_79;
  string_view local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  MapKey *local_28;
  MapKey *b_local;
  MapKey *a_local;
  MapKeyComparator *this_local;
  
  local_28 = b;
  b_local = a;
  a_local = (MapKey *)this;
  CVar3 = MapKey::type(a);
  CVar4 = MapKey::type(local_28);
  local_41 = 0;
  if (CVar3 != CVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x484,"a.type() == b.type()");
    local_41 = 1;
    pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar13);
  }
  if ((local_41 & 1) == 0) {
    CVar3 = MapKey::type(b_local);
    switch(CVar3) {
    case CPPTYPE_INT32:
      iVar5 = MapKey::GetInt32Value(b_local);
      iVar6 = MapKey::GetInt32Value(local_28);
      this_local._7_1_ = iVar5 < iVar6;
      break;
    case CPPTYPE_INT64:
      iVar9 = MapKey::GetInt64Value(b_local);
      iVar10 = MapKey::GetInt64Value(local_28);
      this_local._7_1_ = iVar9 < iVar10;
      break;
    case CPPTYPE_UINT32:
      uVar7 = MapKey::GetUInt32Value(b_local);
      uVar8 = MapKey::GetUInt32Value(local_28);
      this_local._7_1_ = uVar7 < uVar8;
      break;
    case CPPTYPE_UINT64:
      uVar11 = MapKey::GetUInt64Value(b_local);
      uVar12 = MapKey::GetUInt64Value(local_28);
      this_local._7_1_ = uVar11 < uVar12;
      break;
    default:
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x493);
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar13,(char (*) [27])"Invalid key for map field.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar13);
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_90);
      this_local._7_1_ = true;
      break;
    case CPPTYPE_BOOL:
      bVar1 = MapKey::GetBoolValue(b_local);
      bVar2 = MapKey::GetBoolValue(local_28);
      this_local._7_1_ = bVar1 < bVar2;
      break;
    case CPPTYPE_STRING:
      local_68 = MapKey::GetStringValue(b_local);
      local_78 = MapKey::GetStringValue(local_28);
      this_local._7_1_ = std::operator<(local_68,local_78);
    }
    return this_local._7_1_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      ABSL_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          ABSL_DLOG(FATAL) << "Invalid key for map field.";
          return true;
      }
    }